

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void fe_cswap(fe *f,fe *g,fe_limb_t b)

{
  uint i;
  long lVar1;
  ulong uVar2;
  
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    uVar2 = (g->v[lVar1] ^ f->v[lVar1]) & -b;
    f->v[lVar1] = f->v[lVar1] ^ uVar2;
    g->v[lVar1] = g->v[lVar1] ^ uVar2;
  }
  return;
}

Assistant:

static void fe_cswap(fe *f, fe *g, fe_limb_t b) {
  b = 0 - b;
  for (unsigned i = 0; i < FE_NUM_LIMBS; i++) {
    fe_limb_t x = f->v[i] ^ g->v[i];
    x &= b;
    f->v[i] ^= x;
    g->v[i] ^= x;
  }
}